

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::getTestMoreStuff
          (TestInterfaceImpl *this,GetTestMoreStuffContext context)

{
  CapTableBuilder *pCVar1;
  ClientHook *pCVar2;
  long *plVar3;
  long *in_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar4;
  PointerBuilder local_98;
  Fault local_80;
  SegmentBuilder *local_78;
  Own<capnp::ClientHook,_std::nullptr_t> OStack_70;
  kj local_60;
  undefined7 uStack_5f;
  long *local_58;
  StructBuilder local_48;
  
  local_60 = (kj)0x0;
  (**(code **)(*in_RDX + 0x10))(&local_78);
  local_98.pointer = (WirePointer *)OStack_70.ptr;
  local_98.segment = local_78;
  local_98.capTable = (CapTableBuilder *)OStack_70.disposer;
  PointerBuilder::getStruct(&local_48,&local_98,(StructSize)0x10000,(word *)0x0);
  if (context.hook[2]._vptr_CallContextHook != (_func_int **)0x0) {
    kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
              (&local_60,(int *)context.hook[1]._vptr_CallContextHook,
               (int *)context.hook[2]._vptr_CallContextHook);
    local_98.segment = (SegmentBuilder *)CONCAT71(uStack_5f,local_60);
    local_98.capTable = (CapTableBuilder *)((long)local_58 + 0x30);
    if (local_58 == (long *)0x0) {
      local_98.capTable = (CapTableBuilder *)0x0;
    }
    local_58 = (long *)0x0;
    OVar4 = Capability::Client::makeLocalClient
                      ((Client *)&OStack_70,
                       (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_98);
    pCVar1 = local_98.capTable;
    if (local_98.capTable != (CapTableBuilder *)0x0) {
      local_98.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_98.segment)->super_SegmentReader).arena)->_vptr_Arena)
                (local_98.segment,
                 (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
                 (long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader,OVar4.ptr);
    }
    local_78 = (SegmentBuilder *)&capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
    local_98.segment = local_48.segment;
    local_98.capTable = local_48.capTable;
    local_98.pointer = local_48.pointers;
    PointerBuilder::setCapability(&local_98,&OStack_70);
    pCVar2 = OStack_70.ptr;
    if (OStack_70.ptr != (ClientHook *)0x0) {
      OStack_70.ptr = (ClientHook *)0x0;
      (**((CapTableReader *)&(OStack_70.disposer)->_vptr_Disposer)->_vptr_CapTableReader)
                (OStack_70.disposer,
                 (long)&((WireValue<uint32_t> *)&pCVar2->_vptr_ClientHook)->value +
                 *(long *)(*(long *)&pCVar2->_vptr_ClientHook + -0x10));
    }
    plVar3 = local_58;
    if (local_58 != (long *)0x0) {
      local_58 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT71(uStack_5f,local_60))
                ((undefined8 *)CONCAT71(uStack_5f,local_60),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    kj::_::readyNow();
    return (PromiseBase)(PromiseBase)this;
  }
  local_80.exception = (Exception *)0x0;
  local_98.segment = (SegmentBuilder *)0x0;
  local_98.capTable = (CapTableBuilder *)0x0;
  kj::_::Debug::Fault::init
            (&local_80,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
            );
  kj::_::Debug::Fault::fatal(&local_80);
}

Assistant:

kj::Promise<void> TestInterfaceImpl::getTestMoreStuff(GetTestMoreStuffContext context) {
  context.getResults().setCap(
      kj::heap<TestMoreStuffImpl>(callCount, KJ_REQUIRE_NONNULL(handleCount)));
  return kj::READY_NOW;
}